

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetRenderTargets
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 NumRenderTargets,
          ITextureView **ppRenderTargets,ITextureView *pDepthStencil,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  Uint32 local_28 [2];
  ITextureView **local_20;
  ITextureView *local_18;
  undefined8 local_10;
  RESOURCE_STATE_TRANSITION_MODE local_8;
  
  local_10 = 0;
  local_28[0] = NumRenderTargets;
  local_20 = ppRenderTargets;
  local_18 = pDepthStencil;
  local_8 = StateTransitionMode;
  (*(this->super_ObjectBase<Diligent::IDeviceContextVk>).
    super_RefCountedObject<Diligent::IDeviceContextVk>.super_IDeviceContextVk.super_IDeviceContext.
    super_IObject._vptr_IObject[0x11])(this,local_28);
  return;
}

Assistant:

SetRenderTargets(Uint32                         NumRenderTargets,
                                                     ITextureView*                  ppRenderTargets[],
                                                     ITextureView*                  pDepthStencil,
                                                     RESOURCE_STATE_TRANSITION_MODE StateTransitionMode) override final
    {
        return this->SetRenderTargetsExt({NumRenderTargets, ppRenderTargets, pDepthStencil, StateTransitionMode});
    }